

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O1

void test_interpolation_36(void)

{
  run("standalone interpolation should not alter surrounding whitespace","  {{&string}}\n",
      "{\"string\": \"---\"}",(char *)0x0,"  ---\n");
  return;
}

Assistant:

static void
test_interpolation_36(void)
{
    run(
        "standalone interpolation should not alter surrounding whitespace",
        "  {{&string}}\n",
        "{\"string\": \"---\"}",
        NULL,
        "  ---\n"
    );
}